

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QRenderRule::drawFrame(QRenderRule *this,QPainter *p,QRect *rect)

{
  bool bVar1;
  QRenderRule *in_RDX;
  QRenderRule *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect QVar2;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffe0 [16];
  QRenderRule *in_stack_fffffffffffffff0;
  QRenderRule *this_00;
  
  this_00 = *(QRenderRule **)(in_FS_OFFSET + 0x28);
  QPoint::QPoint((QPoint *)in_RSI,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (int)in_stack_ffffffffffffffa8);
  drawBackground(this_00,(QPainter *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe0._8_8_,
                 in_stack_ffffffffffffffe0._0_8_);
  bVar1 = hasBorder(in_RSI);
  if (bVar1) {
    QVar2 = borderRect(in_RDX,in_RDI);
    drawBorder(in_stack_fffffffffffffff0,QVar2._8_8_,QVar2._0_8_);
  }
  if (*(QRenderRule **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::drawFrame(QPainter *p, const QRect& rect)
{
    drawBackground(p, rect);
    if (hasBorder())
        drawBorder(p, borderRect(rect));
}